

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_ram_list_entities_for_policy.cc
# Opt level: O0

void anon_unknown.dwarf_dc1b7::Json2Type(Value *value,RamListEntitiesForPolicyGroupType *item)

{
  bool bVar1;
  Value *pVVar2;
  string local_78;
  string local_58;
  string local_38;
  RamListEntitiesForPolicyGroupType *local_18;
  RamListEntitiesForPolicyGroupType *item_local;
  Value *value_local;
  
  local_18 = item;
  item_local = (RamListEntitiesForPolicyGroupType *)value;
  bVar1 = Json::Value::isMember(value,"GroupName");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"GroupName");
    Json::Value::asString_abi_cxx11_(&local_38,pVVar2);
    std::__cxx11::string::operator=((string *)local_18,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"Comments");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"Comments");
    Json::Value::asString_abi_cxx11_(&local_58,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->comments,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"AttachDate");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"AttachDate");
    Json::Value::asString_abi_cxx11_(&local_78,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->attach_date,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  return;
}

Assistant:

void Json2Type(const Json::Value& value, RamListEntitiesForPolicyGroupType* item) {
  if(value.isMember("GroupName")) {
    item->group_name = value["GroupName"].asString();
  }
  if(value.isMember("Comments")) {
    item->comments = value["Comments"].asString();
  }
  if(value.isMember("AttachDate")) {
    item->attach_date = value["AttachDate"].asString();
  }
}